

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall QXmlStreamReaderPrivate::resolvePublicNamespaces(QXmlStreamReaderPrivate *this)

{
  Tag *pTVar1;
  long lVar2;
  long lVar3;
  NamespaceDeclaration *pNVar4;
  long *plVar5;
  long lVar6;
  pointer pQVar7;
  long lVar8;
  long size;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar1 = (this->super_QXmlStreamPrivateTagStack).tagStack.data;
  lVar2 = (this->super_QXmlStreamPrivateTagStack).tagStack.tos;
  size = ((this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos -
         pTVar1[lVar2].namespaceDeclarationsSize) + 1;
  QList<QXmlStreamNamespaceDeclaration>::resize(&this->publicNamespaceDeclarations,size);
  if (0 < size) {
    lVar8 = 0x18;
    do {
      lVar3 = pTVar1[lVar2].namespaceDeclarationsSize;
      pNVar4 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
      pQVar7 = QList<QXmlStreamNamespaceDeclaration>::data(&this->publicNamespaceDeclarations);
      plVar5 = *(long **)((long)pNVar4 + lVar8 + -0x18 + lVar3 * 0x30);
      if (plVar5 == (long *)0x0) {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
      }
      else {
        local_58.d = (Data *)*plVar5;
        lVar6 = plVar5[1];
        if ((QArrayData *)local_58.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_58.size = *(qsizetype *)((long)pNVar4 + lVar8 + lVar3 * 0x30 + -8);
        local_58.ptr = (char16_t *)
                       (lVar6 + *(long *)((long)pNVar4 + lVar8 + lVar3 * 0x30 + -0x10) * 2);
      }
      QArrayDataPointer<char16_t>::operator=
                ((QArrayDataPointer<char16_t> *)(lVar8 + -0x18 + (long)pQVar7),&local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      plVar5 = *(long **)((long)&pNVar4[lVar3].prefix.m_string + lVar8);
      if (plVar5 == (long *)0x0) {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
      }
      else {
        local_58.d = (Data *)*plVar5;
        lVar6 = plVar5[1];
        if ((QArrayData *)local_58.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_58.size = *(qsizetype *)((long)&pNVar4[lVar3].prefix.m_size + lVar8);
        local_58.ptr = (char16_t *)
                       (lVar6 + *(long *)((long)&pNVar4[lVar3].prefix.m_pos + lVar8) * 2);
      }
      QArrayDataPointer<char16_t>::operator=
                ((QArrayDataPointer<char16_t> *)((long)&(pQVar7->m_prefix).m_string.d + lVar8),
                 &local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      lVar8 = lVar8 + 0x30;
      size = size + -1;
    } while (size != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::resolvePublicNamespaces()
{
    const Tag &tag = tagStack.top();
    qsizetype n = namespaceDeclarations.size() - tag.namespaceDeclarationsSize;
    publicNamespaceDeclarations.resize(n);
    for (qsizetype i = 0; i < n; ++i) {
        const NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.at(tag.namespaceDeclarationsSize + i);
        QXmlStreamNamespaceDeclaration &publicNamespaceDeclaration = publicNamespaceDeclarations[i];
        publicNamespaceDeclaration.m_prefix = namespaceDeclaration.prefix;
        publicNamespaceDeclaration.m_namespaceUri = namespaceDeclaration.namespaceUri;
    }
}